

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::java::GetOneofStoredType_abi_cxx11_(FieldDescriptor *field)

{
  char *pcVar1;
  string *in_RDI;
  undefined4 in_stack_00000008;
  JavaType in_stack_0000000c;
  JavaType javaType;
  FieldDescriptor *in_stack_ffffffffffffffb0;
  allocator *paVar2;
  allocator local_25 [16];
  allocator local_15;
  JavaType local_14;
  string *descriptor;
  
  descriptor = in_RDI;
  local_14 = GetJavaType((FieldDescriptor *)CONCAT44(in_stack_0000000c,in_stack_00000008));
  if (local_14 == JAVATYPE_ENUM) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"java.lang.Integer",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
  }
  else if (local_14 == JAVATYPE_MESSAGE) {
    FieldDescriptor::message_type(in_stack_ffffffffffffffb0);
    ClassName_abi_cxx11_((Descriptor *)descriptor);
  }
  else {
    pcVar1 = BoxedPrimitiveTypeName(in_stack_0000000c);
    paVar2 = local_25;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar1,paVar2);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  return in_RDI;
}

Assistant:

std::string GetOneofStoredType(const FieldDescriptor* field) {
  const JavaType javaType = GetJavaType(field);
  switch (javaType) {
    case JAVATYPE_ENUM:
      return "java.lang.Integer";
    case JAVATYPE_MESSAGE:
      return ClassName(field->message_type());
    default:
      return BoxedPrimitiveTypeName(javaType);
  }
}